

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O0

void __thiscall OpenMD::COHZ::writeCorrelate(COHZ *this)

{
  double dVar1;
  byte bVar2;
  char *pcVar3;
  undefined8 uVar4;
  ostream *poVar5;
  string *psVar6;
  ulong uVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  double *pdVar11;
  DynamicProperty *in_RDI;
  uint j_2;
  uint i_2;
  Revision r_2;
  uint j_1;
  uint i_1;
  Revision r_1;
  uint j;
  uint i;
  Revision r;
  ofstream ofs3;
  ofstream ofs2;
  ofstream ofs1;
  string HHfile;
  string OHfile;
  string Dfile;
  Revision *in_stack_fffffffffffff6a8;
  size_type *psVar12;
  char *in_stack_fffffffffffff6b0;
  value_type vVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6b8;
  Revision *in_stack_fffffffffffff6f8;
  uint local_768;
  uint local_764;
  string local_760 [32];
  string local_740 [40];
  uint local_718;
  uint local_714;
  string local_710 [32];
  string local_6f0 [40];
  uint local_6c8;
  uint local_6c4;
  string local_6c0 [32];
  string local_6a0 [40];
  ostream local_678 [512];
  ostream local_478 [512];
  ostream local_278 [512];
  string local_78 [48];
  string local_48 [32];
  string local_28 [40];
  
  DynamicProperty::getOutputFileName_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
  DynamicProperty::getOutputFileName_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
  DynamicProperty::getOutputFileName_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_278,pcVar3,_S_out);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_478,pcVar3,_S_out);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_678,pcVar3,_S_out);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    uVar4 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"COHz::writeCorrelate Error: failed to open %s\n",uVar4);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar5 = std::operator<<(local_278,"# ");
    psVar6 = TimeCorrFunc<OpenMD::Vector<double,4u>>::getCorrFuncType_abi_cxx11_
                       ((TimeCorrFunc<OpenMD::Vector<double,4u>> *)in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5," for dipole vectors in water\n");
    poVar5 = std::operator<<(local_278,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffff6f8);
    poVar5 = std::operator<<(poVar5,local_6a0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_6a0);
    poVar5 = std::operator<<(local_278,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffff6a8);
    poVar5 = std::operator<<(poVar5,local_6c0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_6c0);
    poVar5 = std::operator<<(local_278,"# selection script1: \"");
    std::operator<<(poVar5,(string *)(in_RDI[0xc].outputFilename_.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(local_278,"\"\tselection script2: \"");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[0xd].outputFilename_._M_string_length);
    std::operator<<(poVar5,"\"\n");
    poVar5 = std::operator<<(local_278,"# privilegedAxis computed as ");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[0x4d].selectionModeRestart_);
    std::operator<<(poVar5," axis \n");
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<(local_278,"# parameters: ");
      poVar5 = std::operator<<(poVar5,(string *)in_RDI[0x47].outputFilename_.field_2._M_local_buf);
      std::operator<<(poVar5,"\n");
    }
    std::operator<<(local_278,"#time\tPn(costheta_z)\n");
    for (local_6c4 = 0; local_6c4 < *(uint *)&in_RDI[1].outputFilename_; local_6c4 = local_6c4 + 1)
    {
      psVar12 = &in_RDI[2].outputFilename_._M_string_length;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)psVar12,(ulong)local_6c4);
      dVar1 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)psVar12,0);
      std::ostream::operator<<(local_278,dVar1 - *pvVar8);
      for (local_6c8 = 0; local_6c8 < *(uint *)&in_RDI[0x4d]._vptr_DynamicProperty;
          local_6c8 = local_6c8 + 1) {
        poVar5 = std::operator<<(local_278,"\t");
        pvVar9 = std::
                 vector<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                               *)(in_RDI + 0x4f),(ulong)local_6c4);
        pvVar10 = std::
                  vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>::
                  operator[](pvVar9,(ulong)local_6c8);
        pdVar11 = Vector<double,_4U>::operator[](pvVar10,0);
        std::ostream::operator<<(poVar5,*pdVar11);
      }
      std::operator<<(local_278,"\n");
    }
  }
  std::ofstream::close();
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    uVar4 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"COHz::writeCorrelate Error: failed to open %s\n",uVar4);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar5 = std::operator<<(local_478,"# ");
    psVar6 = TimeCorrFunc<OpenMD::Vector<double,4u>>::getCorrFuncType_abi_cxx11_
                       ((TimeCorrFunc<OpenMD::Vector<double,4u>> *)in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5," for OH bond vectors in water\n");
    poVar5 = std::operator<<(local_478,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffff6f8);
    poVar5 = std::operator<<(poVar5,local_6f0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_6f0);
    poVar5 = std::operator<<(local_478,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffff6a8);
    poVar5 = std::operator<<(poVar5,local_710);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_710);
    poVar5 = std::operator<<(local_478,"# selection script1: \"");
    std::operator<<(poVar5,(string *)(in_RDI[0xc].outputFilename_.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(local_478,"\"\tselection script2: \"");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[0xd].outputFilename_._M_string_length);
    std::operator<<(poVar5,"\"\n");
    poVar5 = std::operator<<(local_478,"# privilegedAxis computed as ");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[0x4d].selectionModeRestart_);
    std::operator<<(poVar5," axis \n");
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<(local_478,"# parameters: ");
      poVar5 = std::operator<<(poVar5,(string *)in_RDI[0x47].outputFilename_.field_2._M_local_buf);
      std::operator<<(poVar5,"\n");
    }
    std::operator<<(local_478,"#time\tPn(costheta_z)\n");
    for (local_714 = 0; local_714 < *(uint *)&in_RDI[1].outputFilename_; local_714 = local_714 + 1)
    {
      psVar12 = &in_RDI[2].outputFilename_._M_string_length;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)psVar12,(ulong)local_714);
      dVar1 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)psVar12,0);
      std::ostream::operator<<(local_478,dVar1 - *pvVar8);
      for (local_718 = 0; local_718 < *(uint *)&in_RDI[0x4d]._vptr_DynamicProperty;
          local_718 = local_718 + 1) {
        poVar5 = std::operator<<(local_478,"\t");
        pvVar9 = std::
                 vector<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                               *)(in_RDI + 0x4f),(ulong)local_714);
        pvVar10 = std::
                  vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>::
                  operator[](pvVar9,(ulong)local_718);
        pdVar11 = Vector<double,_4U>::operator[](pvVar10,1);
        dVar1 = *pdVar11;
        pvVar9 = std::
                 vector<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                               *)(in_RDI + 0x4f),(ulong)local_714);
        pvVar10 = std::
                  vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>::
                  operator[](pvVar9,(ulong)local_718);
        pdVar11 = Vector<double,_4U>::operator[](pvVar10,2);
        std::ostream::operator<<(poVar5,(dVar1 + *pdVar11) * 0.5);
      }
      std::operator<<(local_478,"\n");
    }
  }
  std::ofstream::close();
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    uVar4 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"COHz::writeCorrelate Error: failed to open %s\n",uVar4);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar5 = std::operator<<(local_678,"# ");
    psVar6 = TimeCorrFunc<OpenMD::Vector<double,4u>>::getCorrFuncType_abi_cxx11_
                       ((TimeCorrFunc<OpenMD::Vector<double,4u>> *)in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5," for HH bond vectors in water\n");
    poVar5 = std::operator<<(local_678,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffff6f8);
    poVar5 = std::operator<<(poVar5,local_740);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_740);
    poVar5 = std::operator<<(local_678,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffff6a8);
    poVar5 = std::operator<<(poVar5,local_760);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_760);
    poVar5 = std::operator<<(local_678,"# selection script1: \"");
    std::operator<<(poVar5,(string *)(in_RDI[0xc].outputFilename_.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(local_678,"\"\tselection script2: \"");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[0xd].outputFilename_._M_string_length);
    std::operator<<(poVar5,"\"\n");
    poVar5 = std::operator<<(local_678,"# privilegedAxis computed as ");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[0x4d].selectionModeRestart_);
    std::operator<<(poVar5," axis \n");
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<(local_678,"# parameters: ");
      poVar5 = std::operator<<(poVar5,(string *)in_RDI[0x47].outputFilename_.field_2._M_local_buf);
      std::operator<<(poVar5,"\n");
    }
    std::operator<<(local_678,"#time\tPn(costheta_z)\n");
    for (local_764 = 0; local_764 < *(uint *)&in_RDI[1].outputFilename_; local_764 = local_764 + 1)
    {
      psVar12 = &in_RDI[2].outputFilename_._M_string_length;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)psVar12,(ulong)local_764);
      vVar13 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)psVar12,0);
      std::ostream::operator<<(local_678,vVar13 - *pvVar8);
      for (local_768 = 0; local_768 < *(uint *)&in_RDI[0x4d]._vptr_DynamicProperty;
          local_768 = local_768 + 1) {
        poVar5 = std::operator<<(local_678,"\t");
        pvVar9 = std::
                 vector<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                               *)(in_RDI + 0x4f),(ulong)local_764);
        pvVar10 = std::
                  vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>::
                  operator[](pvVar9,(ulong)local_768);
        pdVar11 = Vector<double,_4U>::operator[](pvVar10,3);
        std::ostream::operator<<(poVar5,*pdVar11);
      }
      std::operator<<(local_678,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_678);
  std::ofstream::~ofstream(local_478);
  std::ofstream::~ofstream(local_278);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void COHZ::writeCorrelate() {
    std::string Dfile  = getOutputFileName() + "D";
    std::string OHfile = getOutputFileName() + "OH";
    std::string HHfile = getOutputFileName() + "HH";

    std::ofstream ofs1(Dfile.c_str());
    std::ofstream ofs2(OHfile.c_str());
    std::ofstream ofs3(HHfile.c_str());

    if (ofs1.is_open()) {
      Revision r;

      ofs1 << "# " << getCorrFuncType() << " for dipole vectors in water\n";
      ofs1 << "# OpenMD " << r.getFullRevision() << "\n";
      ofs1 << "# " << r.getBuildDate() << "\n";
      ofs1 << "# selection script1: \"" << selectionScript1_;
      ofs1 << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs1 << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs1 << "# parameters: " << paramString_ << "\n";

      ofs1 << "#time\tPn(costheta_z)\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs1 << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs1 << "\t" << histogram_[i][j][0];
        }
        ofs1 << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "COHz::writeCorrelate Error: failed to open %s\n",
               Dfile.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs1.close();

    if (ofs2.is_open()) {
      Revision r;

      ofs2 << "# " << getCorrFuncType() << " for OH bond vectors in water\n";
      ofs2 << "# OpenMD " << r.getFullRevision() << "\n";
      ofs2 << "# " << r.getBuildDate() << "\n";
      ofs2 << "# selection script1: \"" << selectionScript1_;
      ofs2 << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs2 << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs2 << "# parameters: " << paramString_ << "\n";

      ofs2 << "#time\tPn(costheta_z)\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs2 << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs2 << "\t" << 0.5 * (histogram_[i][j][1] + histogram_[i][j][2]);
        }
        ofs2 << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "COHz::writeCorrelate Error: failed to open %s\n",
               OHfile.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs2.close();

    if (ofs3.is_open()) {
      Revision r;

      ofs3 << "# " << getCorrFuncType() << " for HH bond vectors in water\n";
      ofs3 << "# OpenMD " << r.getFullRevision() << "\n";
      ofs3 << "# " << r.getBuildDate() << "\n";
      ofs3 << "# selection script1: \"" << selectionScript1_;
      ofs3 << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs3 << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs3 << "# parameters: " << paramString_ << "\n";

      ofs3 << "#time\tPn(costheta_z)\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs3 << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs3 << "\t" << histogram_[i][j][3];
        }
        ofs3 << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "COHz::writeCorrelate Error: failed to open %s\n",
               HHfile.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs3.close();
  }